

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool CombinationKeyTest<unsigned_int,unsigned_long>
               (hashfunc<unsigned_int> hash,int maxlen,unsigned_long *blocks,int blockcount,
               bool testColl,bool testDist,bool drawDiagram)

{
  undefined1 auVar1 [16];
  byte bVar2;
  ulong uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  size_type sVar4;
  uint in_ECX;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  byte in_stack_00000008;
  bool in_stack_0000004b;
  bool in_stack_0000004c;
  bool in_stack_0000004d;
  bool in_stack_0000004e;
  bool in_stack_0000004f;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000050;
  bool result;
  unsigned_long *key;
  vector<unsigned_int,_std::allocator<unsigned_int>_> hashes;
  pfHash in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  unsigned_long *in_stack_ffffffffffffff70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  uint local_1c;
  uint local_c;
  hashfunc local_8 [8];
  
  local_1d = in_R8B & 1;
  local_1e = in_R9B & 1;
  local_1f = in_stack_00000008 & 1;
  local_1c = in_ECX;
  local_c = in_ESI;
  printf("Keyset \'Combination\' - up to %d blocks from a set of %d - ",(ulong)in_ESI,(ulong)in_ECX)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12c06a);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)local_c;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new__(uVar3);
  pvVar5 = this;
  hashfunc::operator_cast_to_function_pointer(local_8);
  CombinationKeygenRecurse<unsigned_int,unsigned_long>
            ((unsigned_long *)CONCAT44(local_c,in_stack_ffffffffffffff80),
             (int)((ulong)pvVar5 >> 0x20),(int)pvVar5,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(local_1c,in_stack_ffffffffffffff90));
  if (this != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    operator_delete__(this);
  }
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_38);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar2 = TestHashList<unsigned_int>
                    (in_stack_00000050,in_stack_0000004f,in_stack_0000004e,in_stack_0000004d,
                     in_stack_0000004c,in_stack_0000004b);
  printf("\n");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this);
  return (bool)(bVar2 & 1);
}

Assistant:

bool CombinationKeyTest ( hashfunc<hashtype> hash, int maxlen, blocktype* blocks,
                          int blockcount, bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Combination' - up to %d blocks from a set of %d - ",maxlen,blockcount);

  //----------

  std::vector<hashtype> hashes;

  blocktype * key = new blocktype[maxlen];

  CombinationKeygenRecurse(key,0,maxlen,blocks,blockcount,hash,hashes);

  delete [] key;

  printf("%d keys\n",(int)hashes.size());

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}